

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeSorterCreateThread(SortSubtask *pTask,_func_void_ptr_void_ptr *xTask,void *pIn)

{
  int iVar1;
  SQLiteThread *__newthread;
  void *pvVar2;
  
  pTask->pThread = (SQLiteThread *)0x0;
  __newthread = (SQLiteThread *)sqlite3Malloc(0x28);
  if (__newthread != (SQLiteThread *)0x0) {
    __newthread->pOut = (void *)0x0;
    __newthread->xTask = (_func_void_ptr_void_ptr *)0x0;
    __newthread->tid = 0;
    *(undefined8 *)&__newthread->done = 0;
    __newthread->xTask = xTask;
    __newthread->pIn = pIn;
    if (((sqlite3Config.xTestCallback != (_func_int_int *)0x0) &&
        (iVar1 = (*sqlite3Config.xTestCallback)(200), iVar1 != 0)) ||
       (iVar1 = pthread_create((pthread_t *)__newthread,(pthread_attr_t *)0x0,
                               (__start_routine *)xTask,pIn), iVar1 != 0)) {
      __newthread->done = 1;
      pvVar2 = (*xTask)(pIn);
      __newthread->pOut = pvVar2;
    }
    pTask->pThread = __newthread;
    return 0;
  }
  return 7;
}

Assistant:

static int vdbeSorterCreateThread(
  SortSubtask *pTask,             /* Thread will use this task object */
  void *(*xTask)(void*),          /* Routine to run in a separate thread */
  void *pIn                       /* Argument passed into xTask() */
){
  assert( pTask->pThread==0 && pTask->bDone==0 );
  return sqlite3ThreadCreate(&pTask->pThread, xTask, pIn);
}